

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_New_Face(FT_Library library,char *pathname,FT_Long face_index,FT_Face_conflict *aface)

{
  FT_Error FVar1;
  undefined1 local_48 [8];
  FT_Open_Args args;
  
  if (pathname != (char *)0x0) {
    local_48._0_4_ = 4;
    args.pathname = (FT_String *)0x0;
    args.memory_size = (FT_Long)pathname;
    FVar1 = ft_open_face_internal(library,(FT_Open_Args *)local_48,face_index,aface,'\x01');
    return FVar1;
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Face( FT_Library   library,
               const char*  pathname,
               FT_Long      face_index,
               FT_Face     *aface )
  {
    FT_Open_Args  args;


    /* test for valid `library' and `aface' delayed to `FT_Open_Face' */
    if ( !pathname )
      return FT_THROW( Invalid_Argument );

    args.flags    = FT_OPEN_PATHNAME;
    args.pathname = (char*)pathname;
    args.stream   = NULL;

    return ft_open_face_internal( library, &args, face_index, aface, 1 );
  }